

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaTypeFixup(xmlSchemaTypePtr type,xmlSchemaAbstractCtxtPtr actxt)

{
  xmlSchemaTypeType xVar1;
  int iVar2;
  xmlChar *in_R8;
  
  iVar2 = 0;
  if (type != (xmlSchemaTypePtr)0x0) {
    if (actxt->type == 1) {
      xVar1 = type->type;
      if ((xVar1 != XML_SCHEMA_TYPE_BASIC) && ((type->flags & 0x400000) == 0)) {
        if (xVar1 == XML_SCHEMA_TYPE_SIMPLE) {
          iVar2 = xmlSchemaFixupSimpleTypeStageTwo((xmlSchemaParserCtxtPtr)actxt,type);
          return iVar2;
        }
        iVar2 = 0;
        if (xVar1 == XML_SCHEMA_TYPE_COMPLEX) {
          iVar2 = xmlSchemaFixupComplexType((xmlSchemaParserCtxtPtr)actxt,type);
          return iVar2;
        }
      }
    }
    else {
      xmlSchemaInternalErr2
                (actxt,"xmlSchemaTypeFixup","this function needs a parser context",(xmlChar *)0x0,
                 in_R8);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static int
xmlSchemaTypeFixup(xmlSchemaTypePtr type,
                   xmlSchemaAbstractCtxtPtr actxt)
{
    if (type == NULL)
        return(0);
    if (actxt->type != XML_SCHEMA_CTXT_PARSER) {
	AERROR_INT("xmlSchemaTypeFixup",
	    "this function needs a parser context");
	return(-1);
    }
    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);
    if (type->type == XML_SCHEMA_TYPE_COMPLEX)
	return(xmlSchemaFixupComplexType(PCTXT_CAST actxt, type));
    else if (type->type == XML_SCHEMA_TYPE_SIMPLE)
	return(xmlSchemaFixupSimpleTypeStageTwo(PCTXT_CAST actxt, type));
    return(0);
}